

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void llvm::cl::ParseEnvironmentOptions(char *progName,char *envVar,char *Overview)

{
  undefined8 argv;
  bool bVar1;
  cl *this;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 in_R9B;
  undefined7 in_register_00000089;
  StringRef SVar5;
  StringRef Src;
  StringRef Overview_00;
  ulong local_260;
  char *local_228;
  int newArgc;
  char *local_1e8;
  char *local_1d8;
  StringSaver local_1d0;
  StringSaver Saver;
  BumpPtrAllocator A;
  SmallVector<const_char_*,_20U> newArgv;
  undefined1 local_98 [8];
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  envValue;
  char *Overview_local;
  char *envVar_local;
  char *progName_local;
  
  envValue.Storage._32_8_ = Overview;
  if (progName == (char *)0x0) {
    __assert_fail("progName && \"Program name not specified\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                  ,0x40d,
                  "void llvm::cl::ParseEnvironmentOptions(const char *, const char *, const char *)"
                 );
  }
  if (envVar != (char *)0x0) {
    if (envVar == (char *)0x0) {
      local_228 = (char *)0x0;
    }
    else {
      local_228 = (char *)strlen(envVar);
    }
    SVar5.Length = (size_t)local_228;
    SVar5.Data = local_228;
    sys::Process::GetEnv_abi_cxx11_
              ((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_98,(Process *)envVar,SVar5);
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)local_98);
    if (bVar1) {
      SmallVector<const_char_*,_20U>::SmallVector((SmallVector<const_char_*,_20U> *)&A.field_0x60);
      BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::BumpPtrAllocatorImpl
                ((BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)&Saver);
      StringSaver::StringSaver(&local_1d0,(BumpPtrAllocator *)&Saver);
      SVar5 = StringSaver::save(&local_1d0,progName);
      local_1e8 = SVar5.Data;
      local_1d8 = local_1e8;
      SmallVectorTemplateBase<const_char_*,_true>::push_back
                ((SmallVectorTemplateBase<const_char_*,_true> *)&A.field_0x60,&local_1d8);
      Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator*((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_98);
      this = (cl *)std::__cxx11::string::data();
      pcVar2 = (char *)std::__cxx11::string::length();
      Src.Length = (size_t)&local_1d0;
      Src.Data = pcVar2;
      TokenizeGNUCommandLine
                (this,Src,(StringSaver *)&A.field_0x60,(SmallVectorImpl<const_char_*> *)0x0,
                 (bool)in_R9B);
      sVar3 = SmallVectorBase::size((SmallVectorBase *)&A.field_0x60);
      sVar4 = SmallVectorBase::size((SmallVectorBase *)&A.field_0x60);
      argv = envValue.Storage._32_8_;
      if (sVar4 == 0) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<const char *>::operator[](size_type) [T = const char *]"
                     );
      }
      if (envValue.Storage._32_8_ == 0) {
        local_260 = 0;
      }
      else {
        local_260 = strlen((char *)envValue.Storage._32_8_);
      }
      Overview_00.Length = 0;
      Overview_00.Data = (char *)local_260;
      ParseCommandLineOptions
                ((cl *)(sVar3 & 0xffffffff),A._96_4_,(char **)argv,Overview_00,
                 (raw_ostream *)CONCAT71(in_register_00000089,in_R9B));
      BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::~BumpPtrAllocatorImpl
                ((BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)&Saver);
      SmallVector<const_char_*,_20U>::~SmallVector((SmallVector<const_char_*,_20U> *)&A.field_0x60);
    }
    Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Optional((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_98);
    return;
  }
  __assert_fail("envVar && \"Environment variable name missing\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                ,0x40e,
                "void llvm::cl::ParseEnvironmentOptions(const char *, const char *, const char *)");
}

Assistant:

void cl::ParseEnvironmentOptions(const char *progName, const char *envVar,
                                 const char *Overview) {
  // Check args.
  assert(progName && "Program name not specified");
  assert(envVar && "Environment variable name missing");

  // Get the environment variable they want us to parse options out of.
  llvm::Optional<std::string> envValue = sys::Process::GetEnv(StringRef(envVar));
  if (!envValue)
    return;

  // Get program's "name", which we wouldn't know without the caller
  // telling us.
  SmallVector<const char *, 20> newArgv;
  BumpPtrAllocator A;
  StringSaver Saver(A);
  newArgv.push_back(Saver.save(progName).data());

  // Parse the value of the environment variable into a "command line"
  // and hand it off to ParseCommandLineOptions().
  TokenizeGNUCommandLine(*envValue, Saver, newArgv);
  int newArgc = static_cast<int>(newArgv.size());
  ParseCommandLineOptions(newArgc, &newArgv[0], StringRef(Overview));
}